

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugger.cpp
# Opt level: O0

size_t __thiscall breakpoint_recorder::add_func(breakpoint_recorder *this,var *function)

{
  bool bVar1;
  undefined8 uVar2;
  callable *this_00;
  runtime_error *this_01;
  function *this_02;
  function_type *target;
  string *in_stack_ffffffffffffff48;
  runtime_error *in_stack_ffffffffffffff50;
  type_info *in_stack_ffffffffffffff58;
  allocator *paVar3;
  type_info *in_stack_ffffffffffffff60;
  function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
  *in_stack_ffffffffffffff68;
  allocator local_71;
  string local_70 [32];
  function_type *local_50;
  undefined1 local_45;
  allocator local_31;
  any *in_stack_ffffffffffffffd0;
  
  cs_impl::any::type((any *)in_stack_ffffffffffffff50);
  bVar1 = std::type_info::operator==(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if (bVar1) {
    cs_impl::any::const_val<cs::object_method>(in_stack_ffffffffffffffd0);
    cs_impl::any::operator=((any *)in_stack_ffffffffffffff50,(any *)in_stack_ffffffffffffff48);
  }
  else {
    cs_impl::any::type((any *)in_stack_ffffffffffffff50);
    bVar1 = std::type_info::operator!=
                      ((type_info *)in_stack_ffffffffffffff50,(type_info *)in_stack_ffffffffffffff48
                      );
    if (bVar1) {
      local_45 = 1;
      uVar2 = __cxa_allocate_exception(0x28);
      paVar3 = &local_31;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffffd0,
                 "Debugger just can break at specific line or function.",paVar3);
      cs::runtime_error::runtime_error(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      local_45 = 0;
      __cxa_throw(uVar2,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
    }
  }
  this_00 = cs_impl::any::const_val<cs::callable>(in_stack_ffffffffffffffd0);
  local_50 = cs::callable::get_raw_data(this_00);
  std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
  target_type(in_stack_ffffffffffffff68);
  bVar1 = std::type_info::operator!=
                    ((type_info *)in_stack_ffffffffffffff50,(type_info *)in_stack_ffffffffffffff48);
  if (bVar1) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x28);
    paVar3 = &local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"Debugger can not break at CNI function.",paVar3);
    cs::runtime_error::runtime_error(this_01,in_stack_ffffffffffffff48);
    __cxa_throw(this_01,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
  }
  this_02 = std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
            ::target<cs::function>(in_stack_ffffffffffffff68);
  cs::function::set_debugger_state(this_02,true);
  m_id = m_id + 1;
  std::forward_list<breakpoint_recorder::breakpoint,std::allocator<breakpoint_recorder::breakpoint>>
  ::emplace_front<unsigned_long&,cs_impl::any&>
            ((forward_list<breakpoint_recorder::breakpoint,_std::allocator<breakpoint_recorder::breakpoint>_>
              *)in_stack_ffffffffffffff60,(unsigned_long *)in_stack_ffffffffffffff58,
             (any *)in_stack_ffffffffffffff50);
  return m_id;
}

Assistant:

std::size_t add_func(cs::var function)
	{
		if (function.type() == typeid(cs::object_method))
			function = function.const_val<cs::object_method>().callable;
		else if (function.type() != typeid(cs::callable))
			throw cs::runtime_error("Debugger just can break at specific line or function.");
		const cs::callable::function_type &target = function.const_val<cs::callable>().get_raw_data();
		if (target.target_type() != typeid(cs::function))
			throw cs::runtime_error("Debugger can not break at CNI function.");
		target.target<cs::function>()->set_debugger_state(true);
		m_breakpoints.emplace_front(++m_id, function);
		return m_id;
	}